

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O3

void __thiscall
Jupiter::HTTP::Server::hook
          (Server *this,string_view host,string_view name,
          unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          *content)

{
  Data *this_00;
  _Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false> local_10;
  
  this_00 = this->m_data;
  local_10._M_head_impl =
       (content->_M_t).
       super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
       ._M_t.
       super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
       .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl;
  (content->_M_t).
  super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  ._M_t.
  super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl = (Content *)0x0;
  Data::hook(this_00,host,name,
             (unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
              *)&local_10);
  if (local_10._M_head_impl != (Content *)0x0) {
    std::default_delete<Jupiter::HTTP::Server::Content>::operator()
              ((default_delete<Jupiter::HTTP::Server::Content> *)&local_10,local_10._M_head_impl);
  }
  return;
}

Assistant:

void Jupiter::HTTP::Server::hook(std::string_view host, std::string_view name, std::unique_ptr<Content> content) {
	return m_data->hook(host, name, std::move(content));
}